

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha1_Update(SHA1_CTX *context,sha2_byte *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int local_34;
  uint32_t tmp_1;
  int j_1;
  uint32_t tmp;
  int j;
  uint usedspace;
  uint freespace;
  size_t len_local;
  sha2_byte *data_local;
  SHA1_CTX *context_local;
  
  if (len != 0) {
    uVar3 = context->bitcount >> 3;
    uVar1 = (uint)uVar3 & 0x3f;
    _usedspace = len;
    len_local = (size_t)data;
    if ((uVar3 & 0x3f) != 0) {
      uVar2 = 0x40 - uVar1;
      if (len < uVar2) {
        memcpy((void *)((long)context->buffer + (ulong)uVar1),data,len);
        context->bitcount = len * 8 + context->bitcount;
        return;
      }
      memcpy((void *)((long)context->buffer + (ulong)uVar1),data,(ulong)uVar2);
      context->bitcount = (ulong)(uVar2 * 8) + context->bitcount;
      _usedspace = len - uVar2;
      len_local = (size_t)(data + uVar2);
      for (j_1 = 0; j_1 < 0x10; j_1 = j_1 + 1) {
        uVar1 = context->buffer[j_1] >> 0x10 | context->buffer[j_1] << 0x10;
        context->buffer[j_1] = uVar1 >> 8 & 0xff00ff | (uVar1 & 0xff00ff) << 8;
      }
      sha1_Transform(context->state,context->buffer,context->state);
    }
    for (; 0x3f < _usedspace; _usedspace = _usedspace - 0x40) {
      memcpy(context->buffer,(void *)len_local,0x40);
      for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
        uVar1 = context->buffer[local_34] >> 0x10 | context->buffer[local_34] << 0x10;
        context->buffer[local_34] = uVar1 >> 8 & 0xff00ff | (uVar1 & 0xff00ff) << 8;
      }
      sha1_Transform(context->state,context->buffer,context->state);
      context->bitcount = context->bitcount + 0x200;
      len_local = len_local + 0x40;
    }
    if (_usedspace != 0) {
      memcpy(context->buffer,(void *)len_local,_usedspace);
      context->bitcount = _usedspace * 8 + context->bitcount;
    }
  }
  return;
}

Assistant:

void sha1_Update(trezor::SHA1_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	usedspace = (context->bitcount >> 3) % SHA1_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA1_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, freespace);
			context->bitcount += freespace << 3;
			len -= freespace;
			data += freespace;
#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE32(context->buffer[j],context->buffer[j]);
			}
#endif
			sha1_Transform(context->state, context->buffer, context->state);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, len);
			context->bitcount += len << 3;
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= SHA1_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		MEMCPY_BCOPY(context->buffer, data, SHA1_BLOCK_LENGTH);
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 16; j++) {
			REVERSE32(context->buffer[j],context->buffer[j]);
		}
#endif
		sha1_Transform(context->state, context->buffer, context->state);
		context->bitcount += SHA1_BLOCK_LENGTH << 3;
		len -= SHA1_BLOCK_LENGTH;
		data += SHA1_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		context->bitcount += len << 3;
	}
}